

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookie.cpp
# Opt level: O0

bool checkStaticArray(int *val,QByteArrayView dateString,int at,char *array,int size)

{
  char cVar1;
  char cVar2;
  qsizetype qVar3;
  char *__s;
  size_t sVar4;
  int in_ECX;
  int *in_RDI;
  long in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  char *str;
  int i;
  int j;
  int local_44;
  int local_40;
  bool local_19;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QByteArrayView::operator[](&local_18,(long)in_ECX);
  if ((cVar1 < 'a') || (cVar1 = QByteArrayView::operator[](&local_18,(long)in_ECX), 'z' < cVar1)) {
    local_19 = false;
  }
  else {
    if ((*in_RDI == -1) && (qVar3 = QByteArrayView::size(&local_18), in_ECX + 3 <= qVar3)) {
      local_40 = 0;
      for (local_44 = 0; local_44 <= in_R9D; local_44 = (int)sVar4 + 1 + local_44) {
        __s = (char *)(in_R8 + local_44);
        cVar1 = *__s;
        cVar2 = QByteArrayView::operator[](&local_18,(long)in_ECX);
        if (((cVar1 == cVar2) &&
            (cVar1 = __s[1], cVar2 = QByteArrayView::operator[](&local_18,(long)(in_ECX + 1)),
            cVar1 == cVar2)) &&
           (cVar1 = __s[2], cVar2 = QByteArrayView::operator[](&local_18,(long)(in_ECX + 2)),
           cVar1 == cVar2)) {
          *in_RDI = local_40;
          local_19 = true;
          goto LAB_001b59f4;
        }
        sVar4 = strlen(__s);
        local_40 = local_40 + 1;
      }
    }
    local_19 = false;
  }
LAB_001b59f4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

static bool checkStaticArray(int &val, QByteArrayView dateString, int at, const char *array, int size)
{
    if (dateString[at] < 'a' || dateString[at] > 'z')
        return false;
    if (val == -1 && dateString.size() >= at + 3) {
        int j = 0;
        int i = 0;
        while (i <= size) {
            const char *str = array + i;
            if (str[0] == dateString[at]
                && str[1] == dateString[at + 1]
                && str[2] == dateString[at + 2]) {
                val = j;
                return true;
            }
            i += int(strlen(str)) + 1;
            ++j;
        }
    }
    return false;
}